

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

Inst * __thiscall mir::inst::CallInst::deep_copy(CallInst *this)

{
  Inst *other;
  VarId *in_RDI;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *in_stack_ffffffffffffffa0;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  VarId *in_stack_ffffffffffffffd8;
  CallInst *in_stack_ffffffffffffffe0;
  
  other = (Inst *)operator_new(0x50);
  VarId::VarId(in_RDI,(VarId *)other);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,(string *)&in_RDI[1].id);
  std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::vector
            ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
             in_stack_ffffffffffffffe0,
             (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
             in_stack_ffffffffffffffd8);
  CallInst(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
           in_stack_ffffffffffffffc8);
  std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::~vector
            (in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return other;
}

Assistant:

Inst* deep_copy() { return new CallInst(dest, func, params); }